

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint encodeLZ77(uivector *out,Hash *hash,uchar *in,size_t inpos,size_t insize,uint windowsize,
               uint minmatch,uint nicematch,uint lazymatching)

{
  uchar *puVar1;
  ushort *puVar2;
  byte bVar3;
  ushort uVar4;
  uint *puVar5;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  size_t sVar12;
  size_t sVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  uchar *puVar24;
  uchar *puVar26;
  uint uVar27;
  size_t sVar28;
  uint uVar29;
  ulong wpos;
  uint local_9c;
  uint local_7c;
  uchar *puVar25;
  
  uVar9 = windowsize >> 3;
  if (0x1fff < windowsize) {
    uVar9 = windowsize;
  }
  uVar14 = 0x40;
  if (0x1fff < windowsize) {
    uVar14 = 0x102;
  }
  if (windowsize - 0x8001 < 0xffff8000) {
    uVar9 = 0x3c;
  }
  else {
    uVar10 = windowsize - 1;
    if ((windowsize & uVar10) == 0) {
      uVar15 = 0x102;
      if (nicematch < 0x102) {
        uVar15 = nicematch;
      }
      uVar29 = 0;
      bVar6 = false;
      uVar8 = 0;
      local_7c = 0;
      for (; inpos < insize; inpos = inpos + 1) {
        uVar11 = getHash(in,insize,inpos);
        local_9c = 0;
        uVar17 = 0;
        if (uVar11 == 0) {
          if (uVar29 == 0) {
            uVar29 = countZeros(in,insize,inpos);
            uVar17 = (ulong)uVar29;
          }
          else {
            if ((insize < uVar29 + inpos) || (in[(uVar29 + inpos) - 1] != '\0')) {
              uVar29 = uVar29 - 1;
            }
            uVar17 = (ulong)uVar29;
          }
        }
        uVar29 = (uint)uVar17;
        wpos = (ulong)((uint)inpos & uVar10);
        updateHashChain(hash,wpos,uVar11,(unsigned_short)uVar17);
        uVar16 = inpos + 0x102;
        if (insize <= inpos + 0x102) {
          uVar16 = insize;
        }
        puVar1 = in + inpos;
        uVar27 = 0;
        uVar23 = 0;
        uVar18 = 0;
        uVar19 = (ulong)hash->chain[wpos];
        do {
          while( true ) {
            if (uVar18 == uVar9) goto LAB_0011f4f9;
            uVar21 = 0;
            if (wpos < uVar19) {
              uVar21 = (ulong)windowsize;
            }
            uVar21 = (wpos - uVar19) + uVar21;
            uVar20 = (uint)uVar21;
            if (uVar20 < (uint)uVar23) goto LAB_0011f4f9;
            if (uVar21 != 0) {
              puVar26 = in + (inpos - (uVar21 & 0xffffffff));
              puVar24 = puVar1;
              if (2 < uVar29) {
                uVar23 = (ulong)(uint)hash->zeros[uVar19];
                if (uVar29 < hash->zeros[uVar19]) {
                  uVar23 = uVar17;
                }
                puVar26 = puVar26 + uVar23;
                puVar24 = puVar1 + uVar23;
              }
              for (; (puVar25 = in + uVar16, puVar24 != in + uVar16 &&
                     (puVar25 = puVar24, *puVar26 == *puVar24)); puVar26 = puVar26 + 1) {
                puVar24 = puVar24 + 1;
              }
              uVar22 = (int)puVar25 - (int)puVar1;
              if ((uVar27 < uVar22) && (uVar27 = uVar22, local_9c = uVar20, uVar15 <= uVar22))
              goto LAB_0011f4f9;
            }
            uVar4 = hash->chain[uVar19];
            if ((ushort)uVar19 == uVar4) goto LAB_0011f4f9;
            uVar18 = uVar18 + 1;
            if ((2 < uVar29) && (uVar29 < uVar27)) break;
            uVar23 = uVar21 & 0xffffffff;
            uVar19 = (ulong)uVar4;
            if (hash->val[uVar4] != uVar11) goto LAB_0011f4f9;
          }
          puVar2 = hash->chainz + uVar19;
          uVar23 = uVar21 & 0xffffffff;
          uVar19 = (ulong)*puVar2;
        } while (uVar29 == hash->zeros[*puVar2]);
LAB_0011f4f9:
        bVar7 = bVar6;
        if (lazymatching == 0) {
LAB_0011f5c5:
          if ((2 < uVar27) && (windowsize < local_9c)) {
            return 0x56;
          }
          bVar6 = bVar7;
          if (uVar27 < 3) {
            bVar3 = in[inpos];
          }
          else {
            if ((minmatch <= uVar27) && ((uVar27 != 3 || (local_9c < 0x1001)))) {
              sVar12 = searchCodeIndex(LENGTHBASE,0x1d,(ulong)uVar27);
              uVar29 = LENGTHBASE[sVar12 & 0xffffffff];
              sVar13 = searchCodeIndex(DISTANCEBASE,0x1e,(ulong)local_9c);
              uVar11 = DISTANCEBASE[sVar13 & 0xffffffff];
              sVar28 = out->size;
              uVar18 = uivector_resize(out,sVar28 + 4);
              if (uVar18 != 0) {
                puVar5 = out->data;
                puVar5[sVar28] = (int)sVar12 + 0x101;
                puVar5[sVar28 + 1] = uVar27 - uVar29;
                puVar5[sVar28 + 2] = (uint)sVar13;
                puVar5[sVar28 + 3] = local_9c - uVar11;
              }
              uVar11 = 1;
              while( true ) {
                sVar28 = inpos + 1;
                uVar29 = (uint)uVar17;
                if (uVar27 <= uVar11) break;
                uVar18 = getHash(in,insize,sVar28);
                uVar16 = 0;
                if (uVar18 == 0) {
                  if (uVar29 == 0) {
                    uVar29 = countZeros(in,insize,sVar28);
                    uVar16 = (ulong)uVar29;
                  }
                  else {
                    if ((insize < sVar28 + uVar17) || (in[inpos + uVar17] != '\0')) {
                      uVar29 = uVar29 - 1;
                    }
                    uVar16 = (ulong)uVar29;
                  }
                }
                uVar17 = uVar16;
                updateHashChain(hash,(ulong)((uint)sVar28 & uVar10),uVar18,(unsigned_short)uVar17);
                uVar11 = uVar11 + 1;
                inpos = sVar28;
              }
              goto LAB_0011f618;
            }
            bVar3 = in[inpos];
          }
          uVar11 = uivector_push_back(out,(uint)bVar3);
          if (uVar11 == 0) {
            return 0x53;
          }
        }
        else {
          if ((bVar6) || (uVar27 < 3)) {
            bVar7 = false;
            if (bVar6) {
              if (inpos == 0) {
                return 0x51;
              }
              if (uVar8 + 1 < uVar27) {
                uVar11 = uivector_push_back(out,(uint)in[inpos - 1]);
                if (uVar11 == 0) {
                  return 0x53;
                }
              }
              else {
                hash->head[uVar11] = -1;
                hash->headz[uVar17] = -1;
                inpos = inpos - 1;
                local_9c = local_7c;
                uVar27 = uVar8;
              }
            }
            goto LAB_0011f5c5;
          }
          bVar7 = false;
          if (uVar14 < uVar27 || 0x101 < uVar27) goto LAB_0011f5c5;
          local_7c = local_9c;
          bVar6 = true;
          uVar8 = uVar27;
        }
LAB_0011f618:
      }
      uVar9 = 0;
    }
    else {
      uVar9 = 0x5a;
    }
  }
  return uVar9;
}

Assistant:

static unsigned encodeLZ77(uivector* out, Hash* hash,
                           const unsigned char* in, size_t inpos, size_t insize, unsigned windowsize,
                           unsigned minmatch, unsigned nicematch, unsigned lazymatching) {
  size_t pos;
  unsigned i, error = 0;
  /*for large window lengths, assume the user wants no compression loss. Otherwise, max hash chain length speedup.*/
  unsigned maxchainlength = windowsize >= 8192 ? windowsize : windowsize / 8u;
  unsigned maxlazymatch = windowsize >= 8192 ? MAX_SUPPORTED_DEFLATE_LENGTH : 64;

  unsigned usezeros = 1; /*not sure if setting it to false for windowsize < 8192 is better or worse*/
  unsigned numzeros = 0;

  unsigned offset; /*the offset represents the distance in LZ77 terminology*/
  unsigned length;
  unsigned lazy = 0;
  unsigned lazylength = 0, lazyoffset = 0;
  unsigned hashval;
  unsigned current_offset, current_length;
  unsigned prev_offset;
  const unsigned char *lastptr, *foreptr, *backptr;
  unsigned hashpos;

  if(windowsize == 0 || windowsize > 32768) return 60; /*error: windowsize smaller/larger than allowed*/
  if((windowsize & (windowsize - 1)) != 0) return 90; /*error: must be power of two*/

  if(nicematch > MAX_SUPPORTED_DEFLATE_LENGTH) nicematch = MAX_SUPPORTED_DEFLATE_LENGTH;

  for(pos = inpos; pos < insize; ++pos) {
    size_t wpos = pos & (windowsize - 1); /*position for in 'circular' hash buffers*/
    unsigned chainlength = 0;

    hashval = getHash(in, insize, pos);

    if(usezeros && hashval == 0) {
      if(numzeros == 0) numzeros = countZeros(in, insize, pos);
      else if(pos + numzeros > insize || in[pos + numzeros - 1] != 0) --numzeros;
    } else {
      numzeros = 0;
    }

    updateHashChain(hash, wpos, hashval, numzeros);

    /*the length and offset found for the current position*/
    length = 0;
    offset = 0;

    hashpos = hash->chain[wpos];

    lastptr = &in[insize < pos + MAX_SUPPORTED_DEFLATE_LENGTH ? insize : pos + MAX_SUPPORTED_DEFLATE_LENGTH];

    /*search for the longest string*/
    prev_offset = 0;
    for(;;) {
      if(chainlength++ >= maxchainlength) break;
      current_offset = (unsigned)(hashpos <= wpos ? wpos - hashpos : wpos - hashpos + windowsize);

      if(current_offset < prev_offset) break; /*stop when went completely around the circular buffer*/
      prev_offset = current_offset;
      if(current_offset > 0) {
        /*test the next characters*/
        foreptr = &in[pos];
        backptr = &in[pos - current_offset];

        /*common case in PNGs is lots of zeros. Quickly skip over them as a speedup*/
        if(numzeros >= 3) {
          unsigned skip = hash->zeros[hashpos];
          if(skip > numzeros) skip = numzeros;
          backptr += skip;
          foreptr += skip;
        }

        while(foreptr != lastptr && *backptr == *foreptr) /*maximum supported length by deflate is max length*/ {
          ++backptr;
          ++foreptr;
        }
        current_length = (unsigned)(foreptr - &in[pos]);

        if(current_length > length) {
          length = current_length; /*the longest length*/
          offset = current_offset; /*the offset that is related to this longest length*/
          /*jump out once a length of max length is found (speed gain). This also jumps
          out if length is MAX_SUPPORTED_DEFLATE_LENGTH*/
          if(current_length >= nicematch) break;
        }
      }

      if(hashpos == hash->chain[hashpos]) break;

      if(numzeros >= 3 && length > numzeros) {
        hashpos = hash->chainz[hashpos];
        if(hash->zeros[hashpos] != numzeros) break;
      } else {
        hashpos = hash->chain[hashpos];
        /*outdated hash value, happens if particular value was not encountered in whole last window*/
        if(hash->val[hashpos] != (int)hashval) break;
      }
    }

    if(lazymatching) {
      if(!lazy && length >= 3 && length <= maxlazymatch && length < MAX_SUPPORTED_DEFLATE_LENGTH) {
        lazy = 1;
        lazylength = length;
        lazyoffset = offset;
        continue; /*try the next byte*/
      }
      if(lazy) {
        lazy = 0;
        if(pos == 0) ERROR_BREAK(81);
        if(length > lazylength + 1) {
          /*push the previous character as literal*/
          if(!uivector_push_back(out, in[pos - 1])) ERROR_BREAK(83 /*alloc fail*/);
        } else {
          length = lazylength;
          offset = lazyoffset;
          hash->head[hashval] = -1; /*the same hashchain update will be done, this ensures no wrong alteration*/
          hash->headz[numzeros] = -1; /*idem*/
          --pos;
        }
      }
    }
    if(length >= 3 && offset > windowsize) ERROR_BREAK(86 /*too big (or overflown negative) offset*/);

    /*encode it as length/distance pair or literal value*/
    if(length < 3) /*only lengths of 3 or higher are supported as length/distance pair*/ {
      if(!uivector_push_back(out, in[pos])) ERROR_BREAK(83 /*alloc fail*/);
    } else if(length < minmatch || (length == 3 && offset > 4096)) {
      /*compensate for the fact that longer offsets have more extra bits, a
      length of only 3 may be not worth it then*/
      if(!uivector_push_back(out, in[pos])) ERROR_BREAK(83 /*alloc fail*/);
    } else {
      addLengthDistance(out, length, offset);
      for(i = 1; i < length; ++i) {
        ++pos;
        wpos = pos & (windowsize - 1);
        hashval = getHash(in, insize, pos);
        if(usezeros && hashval == 0) {
          if(numzeros == 0) numzeros = countZeros(in, insize, pos);
          else if(pos + numzeros > insize || in[pos + numzeros - 1] != 0) --numzeros;
        } else {
          numzeros = 0;
        }
        updateHashChain(hash, wpos, hashval, numzeros);
      }
    }
  } /*end of the loop through each character of input*/

  return error;
}